

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FStream.cxx
# Opt level: O3

BOM adios2sys::FStream::ReadBOM(istream *in)

{
  undefined8 uVar1;
  BOM BVar2;
  long lVar3;
  uchar bom [4];
  char local_1c;
  char local_1b;
  char local_1a;
  char local_19;
  
  if (*(int *)(in + *(long *)(*(long *)in + -0x18) + 0x20) != 0) {
    return BOM_None;
  }
  uVar1 = std::istream::tellg();
  std::istream::read((char *)in,(long)&local_1c);
  lVar3 = *(long *)(*(long *)in + -0x18);
  if (*(int *)(in + lVar3 + 0x20) == 0) {
    if (local_1b == -0x45 && local_1c == -0x11) {
      std::istream::read((char *)in,(long)&local_1a);
      lVar3 = *(long *)(*(long *)in + -0x18);
      if ((*(int *)(in + lVar3 + 0x20) == 0) && (local_1a == -0x41)) {
        return BOM_UTF8;
      }
    }
    else {
      if (local_1b == -1 && local_1c == -2) {
        return BOM_UTF16BE;
      }
      if (local_1c == '\0' && local_1b == '\0') {
        std::istream::read((char *)in,(long)&local_1a);
        lVar3 = *(long *)(*(long *)in + -0x18);
        if (((*(int *)(in + lVar3 + 0x20) == 0) && (local_1a == -2)) && (local_19 == -1)) {
          return BOM_UTF32BE;
        }
      }
      else if (local_1b == -2 && local_1c == -1) {
        uVar1 = std::istream::tellg();
        std::istream::read((char *)in,(long)&local_1a);
        BVar2 = BOM_UTF16LE;
        if (((*(int *)(in + *(long *)(*(long *)in + -0x18) + 0x20) == 0) && (local_1a == '\0')) &&
           (local_19 == '\0')) {
          return BOM_UTF32LE;
        }
        goto LAB_007283f8;
      }
    }
  }
  BVar2 = BOM_None;
  std::ios::clear((int)lVar3 + (int)in);
LAB_007283f8:
  std::istream::seekg(in,uVar1,0);
  return BVar2;
}

Assistant:

BOM ReadBOM(std::istream& in)
{
  if (!in.good()) {
    return BOM_None;
  }
  unsigned long orig = in.tellg();
  unsigned char bom[4];
  in.read(reinterpret_cast<char*>(bom), 2);
  if (!in.good()) {
    in.clear();
    in.seekg(orig);
    return BOM_None;
  }
  if (bom[0] == 0xEF && bom[1] == 0xBB) {
    in.read(reinterpret_cast<char*>(bom + 2), 1);
    if (in.good() && bom[2] == 0xBF) {
      return BOM_UTF8;
    }
  } else if (bom[0] == 0xFE && bom[1] == 0xFF) {
    return BOM_UTF16BE;
  } else if (bom[0] == 0x00 && bom[1] == 0x00) {
    in.read(reinterpret_cast<char*>(bom + 2), 2);
    if (in.good() && bom[2] == 0xFE && bom[3] == 0xFF) {
      return BOM_UTF32BE;
    }
  } else if (bom[0] == 0xFF && bom[1] == 0xFE) {
    unsigned long p = in.tellg();
    in.read(reinterpret_cast<char*>(bom + 2), 2);
    if (in.good() && bom[2] == 0x00 && bom[3] == 0x00) {
      return BOM_UTF32LE;
    }
    in.seekg(p);
    return BOM_UTF16LE;
  }
  in.clear();
  in.seekg(orig);
  return BOM_None;
}